

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

bool __thiscall
ImPlot::LineStripRenderer<ImPlot::GetterYs<unsigned_long_long>,_ImPlot::TransformerLogLin>::
operator()(LineStripRenderer<ImPlot::GetterYs<unsigned_long_long>,_ImPlot::TransformerLogLin> *this,
          ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  float *pfVar1;
  unsigned_long_long uVar2;
  double dVar3;
  ImVec2 IVar4;
  int iVar5;
  ImU32 IVar6;
  uint uVar7;
  GetterYs<unsigned_long_long> *pGVar8;
  TransformerLogLin *pTVar9;
  ImPlotPlot *pIVar10;
  ImDrawVert *pIVar11;
  ImDrawIdx *pIVar12;
  ImPlotContext *pIVar13;
  ImDrawIdx IVar14;
  bool bVar15;
  float fVar16;
  double dVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  
  pIVar13 = GImPlot;
  pGVar8 = this->Getter;
  pTVar9 = this->Transformer;
  iVar5 = pGVar8->Count;
  uVar2 = *(unsigned_long_long *)
           ((long)pGVar8->Ys +
           (long)(((prim + 1 + pGVar8->Offset) % iVar5 + iVar5) % iVar5) * (long)pGVar8->Stride);
  dVar17 = log10(((double)(prim + 1) * pGVar8->XScale + pGVar8->X0) /
                 (GImPlot->CurrentPlot->XAxis).Range.Min);
  pIVar10 = pIVar13->CurrentPlot;
  dVar3 = (pIVar10->XAxis).Range.Min;
  iVar5 = pTVar9->YAxis;
  fVar20 = (float)((((double)(float)(dVar17 / pIVar13->LogDenX) *
                     ((pIVar10->XAxis).Range.Max - dVar3) + dVar3) - dVar3) * pIVar13->Mx +
                  (double)pIVar13->PixelRange[iVar5].Min.x);
  fVar21 = (float)(((((double)CONCAT44(0x45300000,(int)(uVar2 >> 0x20)) - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0)) -
                   pIVar10->YAxis[iVar5].Range.Min) * pIVar13->My[iVar5] +
                  (double)pIVar13->PixelRange[iVar5].Min.y);
  fVar19 = (this->P1).x;
  fVar22 = (this->P1).y;
  fVar18 = fVar22;
  if (fVar21 <= fVar22) {
    fVar18 = fVar21;
  }
  bVar15 = false;
  if ((fVar18 < (cull_rect->Max).y) &&
     (fVar18 = (float)(-(uint)(fVar21 <= fVar22) & (uint)fVar22 |
                      ~-(uint)(fVar21 <= fVar22) & (uint)fVar21), pfVar1 = &(cull_rect->Min).y,
     bVar15 = false, *pfVar1 <= fVar18 && fVar18 != *pfVar1)) {
    fVar18 = fVar19;
    if (fVar20 <= fVar19) {
      fVar18 = fVar20;
    }
    if (fVar18 < (cull_rect->Max).x) {
      fVar18 = (float)(~-(uint)(fVar20 <= fVar19) & (uint)fVar20 |
                      -(uint)(fVar20 <= fVar19) & (uint)fVar19);
      bVar15 = (cull_rect->Min).x <= fVar18 && fVar18 != (cull_rect->Min).x;
    }
  }
  if (bVar15 != false) {
    fVar18 = this->Weight;
    IVar6 = this->Col;
    IVar4 = *uv;
    fVar19 = fVar20 - fVar19;
    fVar22 = fVar21 - fVar22;
    fVar16 = fVar19 * fVar19 + fVar22 * fVar22;
    if (0.0 < fVar16) {
      if (fVar16 < 0.0) {
        fVar16 = sqrtf(fVar16);
      }
      else {
        fVar16 = SQRT(fVar16);
      }
      fVar19 = fVar19 * (1.0 / fVar16);
      fVar22 = fVar22 * (1.0 / fVar16);
    }
    fVar18 = fVar18 * 0.5;
    fVar19 = fVar19 * fVar18;
    fVar18 = fVar18 * fVar22;
    pIVar11 = DrawList->_VtxWritePtr;
    (pIVar11->pos).x = (this->P1).x + fVar18;
    (pIVar11->pos).y = (this->P1).y - fVar19;
    pIVar11->uv = IVar4;
    pIVar11 = DrawList->_VtxWritePtr;
    pIVar11->col = IVar6;
    pIVar11[1].pos.x = fVar18 + fVar20;
    pIVar11[1].pos.y = fVar21 - fVar19;
    pIVar11[1].uv = IVar4;
    pIVar11 = DrawList->_VtxWritePtr;
    pIVar11[1].col = IVar6;
    pIVar11[2].pos.x = fVar20 - fVar18;
    pIVar11[2].pos.y = fVar19 + fVar21;
    pIVar11[2].uv = IVar4;
    pIVar11 = DrawList->_VtxWritePtr;
    pIVar11[2].col = IVar6;
    pIVar11[3].pos.x = (this->P1).x - fVar18;
    pIVar11[3].pos.y = fVar19 + (this->P1).y;
    pIVar11[3].uv = IVar4;
    pIVar11 = DrawList->_VtxWritePtr;
    pIVar11[3].col = IVar6;
    DrawList->_VtxWritePtr = pIVar11 + 4;
    uVar7 = DrawList->_VtxCurrentIdx;
    pIVar12 = DrawList->_IdxWritePtr;
    IVar14 = (ImDrawIdx)uVar7;
    *pIVar12 = IVar14;
    pIVar12[1] = IVar14 + 1;
    pIVar12[2] = IVar14 + 2;
    pIVar12[3] = IVar14;
    pIVar12[4] = IVar14 + 2;
    pIVar12[5] = IVar14 + 3;
    DrawList->_IdxWritePtr = pIVar12 + 6;
    DrawList->_VtxCurrentIdx = uVar7 + 4;
  }
  IVar4.y = fVar21;
  IVar4.x = fVar20;
  this->P1 = IVar4;
  return bVar15;
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        ImVec2 P2 = Transformer(Getter(prim + 1));
        if (!cull_rect.Overlaps(ImRect(ImMin(P1, P2), ImMax(P1, P2)))) {
            P1 = P2;
            return false;
        }
        AddLine(P1,P2,Weight,Col,DrawList,uv);
        P1 = P2;
        return true;
    }